

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.h
# Opt level: O1

void __thiscall GUIComponent::GUIComponent(GUIComponent *this,GUIComponent *other)

{
  undefined8 uVar1;
  
  (this->UniformName)._M_dataplus._M_p = (pointer)&(this->UniformName).field_2;
  (this->UniformName)._M_string_length = 0;
  (this->UniformName).field_2._M_local_buf[0] = '\0';
  this->Type = other->Type;
  this->UniformType = other->UniformType;
  std::__cxx11::string::_M_assign((string *)&this->UniformName);
  this->IsInUse = other->IsInUse;
  this->field_4 = other->field_4;
  uVar1 = *(undefined8 *)(other->Data + 2);
  *(undefined8 *)this->Data = *(undefined8 *)other->Data;
  *(undefined8 *)(this->Data + 2) = uVar1;
  return;
}

Assistant:

GUIComponent(const GUIComponent& other) {
        Type = other.Type;
        UniformType = other.UniformType;
        UniformName = other.UniformName;
        IsInUse = other.IsInUse;
        SliderRange = other.SliderRange;
        memcpy(Data, other.Data, sizeof(Data));
    }